

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O0

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoLinear>::InitializeIntegrationRule
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoLinear> *this)

{
  undefined4 uVar1;
  int64_t iVar2;
  TPZManVector<int,_3> *this_00;
  long *size;
  ostream *poVar3;
  TPZCompElSide *this_01;
  long *in_RDI;
  TPZManVector<int,_3> orderdim;
  int order;
  TPZInterpolationSpace *msp;
  int64_t iref;
  TPZStack<int,_10> ordervec;
  int dim;
  TPZGeoEl *gel;
  int64_t nref;
  TPZMatCombinedSpaces *material;
  TPZMaterial *basemat;
  size_t in_stack_00000308;
  char *in_stack_00000310;
  int in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  TPZCompEl *in_stack_fffffffffffffef8;
  TPZCompEl *in_stack_ffffffffffffff00;
  int *in_stack_ffffffffffffff10;
  int64_t local_80;
  undefined1 local_78 [76];
  undefined4 local_2c;
  TPZGeoEl *local_28;
  int64_t local_20;
  long *local_18;
  TPZManVector<int,_3> *local_10;
  
  iVar2 = TPZVec<TPZCompElSide>::NElements((TPZVec<TPZCompElSide> *)(in_RDI + 0xf));
  if (iVar2 == 0) {
    pzinternal::DebugStopImpl(in_stack_00000310,in_stack_00000308);
  }
  this_00 = (TPZManVector<int,_3> *)(**(code **)(*in_RDI + 0xb8))();
  local_10 = this_00;
  if (this_00 == (TPZManVector<int,_3> *)0x0) {
    size = (long *)0x0;
  }
  else {
    size = (long *)__dynamic_cast(this_00,&TPZMaterial::typeinfo,&TPZMatCombinedSpaces::typeinfo,
                                  0xfffffffffffffffe);
  }
  local_18 = size;
  if (size == (long *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error at ");
    poVar3 = std::operator<<(poVar3,
                             "virtual void TPZMultiphysicsCompEl<pzgeom::TPZGeoLinear>::InitializeIntegrationRule() [TGeometry = pzgeom::TPZGeoLinear]"
                            );
    std::operator<<(poVar3," this->Material() == NULL\n");
    pzinternal::DebugStopImpl(in_stack_00000310,in_stack_00000308);
  }
  local_20 = TPZVec<TPZCompElSide>::size((TPZVec<TPZCompElSide> *)(in_RDI + 0xf));
  local_28 = TPZCompEl::Reference(in_stack_fffffffffffffef8);
  local_2c = (**(code **)(*(long *)local_28 + 0x210))();
  TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)in_stack_ffffffffffffff00);
  for (local_80 = 0; local_80 < local_20; local_80 = local_80 + 1) {
    in_stack_ffffffffffffff10 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 8),local_80);
    if (*in_stack_ffffffffffffff10 != 0) {
      this_01 = TPZVec<TPZCompElSide>::operator[]((TPZVec<TPZCompElSide> *)(in_RDI + 0xf),local_80);
      in_stack_ffffffffffffff00 = TPZCompElSide::Element(this_01);
      if (in_stack_ffffffffffffff00 == (TPZCompEl *)0x0) {
        in_stack_fffffffffffffef8 = (TPZCompEl *)0x0;
      }
      else {
        in_stack_fffffffffffffef8 =
             (TPZCompEl *)
             __dynamic_cast(in_stack_ffffffffffffff00,&TPZCompEl::typeinfo,
                            &TPZInterpolationSpace::typeinfo,0);
      }
      if (in_stack_fffffffffffffef8 != (TPZCompEl *)0x0) {
        in_stack_fffffffffffffef4 = (**(code **)(*(long *)in_stack_fffffffffffffef8 + 0x268))();
        TPZStack<int,_10>::Push
                  ((TPZStack<int,_10> *)
                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   in_stack_fffffffffffffeec);
      }
    }
  }
  uVar1 = (**(code **)(*local_18 + 0x48))(local_18,local_78);
  TPZManVector<int,_3>::TPZManVector(this_00,(int64_t)size,in_stack_ffffffffffffff10);
  TPZInt1d::SetOrder((TPZInt1d *)in_stack_ffffffffffffff00,(TPZVec<int> *)in_stack_fffffffffffffef8,
                     in_stack_fffffffffffffef4);
  TPZManVector<int,_3>::~TPZManVector
            ((TPZManVector<int,_3> *)CONCAT44(in_stack_fffffffffffffef4,uVar1));
  TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x1b530aa);
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::InitializeIntegrationRule()
{
    if (fElementVec.NElements() == 0) {
        DebugStop(); // This case should be treated before
    }
    
    auto basemat = this->Material();
    auto *material =
        dynamic_cast<TPZMatCombinedSpaces*>(basemat);
    if(!material){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " this->Material() == NULL\n";
        DebugStop();
    }
    
    const int64_t nref = fElementVec.size();
    TPZGeoEl *gel = this->Reference();
    int dim = gel->Dimension();
    TPZStack<int> ordervec;
    for (int64_t iref=0;  iref<nref; iref++)
    {
        if(fActiveApproxSpace[iref] == 0){
            continue;
        }
        TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[iref].Element());
        if(msp)
        {
            ordervec.Push(msp->MaxOrder());
        }
    }
    int order = material->IntegrationRuleOrder(ordervec);
    TPZManVector<int,3> orderdim(dim,order);
    fIntRule.SetOrder(orderdim);
    
}